

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O1

int Cec2_ManSimulate(Gia_Man_t *p,Vec_Int_t *vTriples,Cec2_Man_t *pMan)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  word *pwVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  timespec ts;
  timespec local_38;
  
  iVar5 = clock_gettime(3,&local_38);
  if (iVar5 < 0) {
    lVar8 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  iVar5 = p->nObjs;
  if ((0 < (long)iVar5) && (pGVar2 = p->pObjs, pGVar2 != (Gia_Obj_t *)0x0)) {
    lVar9 = 0;
    do {
      uVar12 = *(ulong *)(pGVar2 + lVar9);
      uVar7 = (uint)uVar12;
      if ((~uVar7 & 0x1fffffff) != 0 && -1 < (int)uVar7) {
        uVar15 = p->nSimWords;
        uVar10 = (ulong)uVar15;
        iVar6 = (int)lVar9;
        if ((int)(iVar6 * uVar15) < 0) goto LAB_0064cb02;
        iVar1 = p->vSims->nSize;
        if (iVar1 <= (int)(iVar6 * uVar15)) goto LAB_0064cb02;
        uVar11 = uVar7 & 0x1fffffff;
        iVar13 = (iVar6 - uVar11) * uVar15;
        if ((iVar13 < 0) || (iVar1 <= iVar13)) goto LAB_0064cb02;
        uVar14 = (uint)(uVar12 >> 0x20) & 0x1fffffff;
        iVar13 = (iVar6 - uVar14) * uVar15;
        if ((iVar13 < 0) || (iVar1 <= iVar13)) goto LAB_0064cb02;
        pwVar4 = p->vSims->pArray;
        if ((uVar7 >> 0x1d & 1) == 0) {
          if ((uVar12 >> 0x3d & 1) == 0) {
            if (0 < (int)uVar15) {
              uVar12 = 0;
              do {
                pwVar4[uVar15 * iVar6 + uVar12] =
                     pwVar4[(iVar6 - uVar14) * uVar15 + uVar12] &
                     pwVar4[(iVar6 - uVar11) * uVar15 + uVar12];
                uVar12 = uVar12 + 1;
              } while (uVar10 != uVar12);
            }
          }
          else if (0 < (int)uVar15) {
            uVar12 = 0;
            do {
              pwVar4[uVar15 * iVar6 + uVar12] =
                   ~pwVar4[(iVar6 - uVar14) * uVar15 + uVar12] &
                   pwVar4[(iVar6 - uVar11) * uVar15 + uVar12];
              uVar12 = uVar12 + 1;
            } while (uVar10 != uVar12);
          }
        }
        else if ((uVar12 >> 0x3d & 1) == 0) {
          if (0 < (int)uVar15) {
            uVar12 = 0;
            do {
              pwVar4[uVar15 * iVar6 + uVar12] =
                   ~pwVar4[(iVar6 - uVar11) * uVar15 + uVar12] &
                   pwVar4[(iVar6 - uVar14) * uVar15 + uVar12];
              uVar12 = uVar12 + 1;
            } while (uVar10 != uVar12);
          }
        }
        else if (0 < (int)uVar15) {
          uVar12 = 0;
          do {
            pwVar4[uVar15 * iVar6 + uVar12] =
                 ~(pwVar4[(iVar6 - uVar14) * uVar15 + uVar12] |
                  pwVar4[(iVar6 - uVar11) * uVar15 + uVar12]);
            uVar12 = uVar12 + 1;
          } while (uVar10 != uVar12);
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != iVar5);
  }
  iVar5 = clock_gettime(3,&local_38);
  if (iVar5 < 0) {
    lVar9 = -1;
  }
  else {
    lVar9 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
  }
  pMan->timeSim = pMan->timeSim + lVar9 + lVar8;
  if (p->pReprs == (Gia_Rpr_t *)0x0) {
    iVar5 = 0;
  }
  else {
    iVar5 = 0;
    if ((vTriples != (Vec_Int_t *)0x0) && (iVar5 = 0, 2 < vTriples->nSize)) {
      piVar3 = vTriples->pArray;
      iVar5 = 0;
      lVar8 = 2;
      do {
        uVar7 = piVar3[lVar8 + -2] * p->nSimWords;
        if (((((int)uVar7 < 0) || (iVar6 = p->vSims->nSize, iVar6 <= (int)uVar7)) ||
            (uVar15 = piVar3[lVar8 + -1] * p->nSimWords, (int)uVar15 < 0)) || (iVar6 <= (int)uVar15)
           ) {
LAB_0064cb02:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        uVar11 = piVar3[lVar8];
        if ((int)uVar11 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        pwVar4 = p->vSims->pArray;
        iVar5 = iVar5 + (~((*(uint *)((long)pwVar4 + (ulong)(uVar11 >> 6) * 4 + (ulong)uVar15 * 8) ^
                           *(uint *)((long)pwVar4 + (ulong)(uVar11 >> 6) * 4 + (ulong)uVar7 * 8)) >>
                           ((byte)uVar11 >> 1 & 0x1f) ^ uVar11) & 1);
        lVar8 = lVar8 + 3;
      } while ((int)lVar8 < vTriples->nSize);
    }
    iVar6 = clock_gettime(3,&local_38);
    if (iVar6 < 0) {
      lVar8 = 1;
    }
    else {
      lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
      lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_38.tv_sec * -1000000;
    }
    if (0 < p->nObjs) {
      lVar9 = 0;
      do {
        if (((~(uint)p->pReprs[lVar9] & 0xfffffff) == 0) && (0 < p->pNexts[lVar9])) {
          Cec2_ManSimClassRefineOne(p,(int)lVar9);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < p->nObjs);
    }
    iVar6 = clock_gettime(3,&local_38);
    if (iVar6 < 0) {
      lVar9 = -1;
    }
    else {
      lVar9 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
    }
    pMan->timeRefine = pMan->timeRefine + lVar9 + lVar8;
  }
  return iVar5;
}

Assistant:

int Cec2_ManSimulate( Gia_Man_t * p, Vec_Int_t * vTriples, Cec2_Man_t * pMan )
{
    extern void Cec2_ManSimClassRefineOne( Gia_Man_t * p, int iRepr );
    abctime clk = Abc_Clock();
    Gia_Obj_t * pObj; 
    int i, iRepr, iObj, Entry, Count = 0;
    //Cec2_ManSaveCis( p );
    Gia_ManForEachAnd( p, pObj, i )
        Cec2_ObjSimAnd( p, i );
    pMan->timeSim += Abc_Clock() - clk;
    if ( p->pReprs == NULL )
        return 0;
    if ( vTriples )
    {
        Vec_IntForEachEntryTriple( vTriples, iRepr, iObj, Entry, i )
        {
            word * pSim0 = Cec2_ObjSim( p, iRepr );
            word * pSim1 = Cec2_ObjSim( p, iObj );
            int iPat     = Abc_Lit2Var(Entry);
            int fPhase   = Abc_LitIsCompl(Entry);
            if ( (fPhase ^ Abc_InfoHasBit((unsigned *)pSim0, iPat)) == Abc_InfoHasBit((unsigned *)pSim1, iPat) )
                Count++;
        }
    }
    clk = Abc_Clock();
    Gia_ManForEachClass0( p, i )
        Cec2_ManSimClassRefineOne( p, i );
    pMan->timeRefine += Abc_Clock() - clk;
    return Count;
}